

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_pass.cc
# Opt level: O0

ssize_t sock_fd_read(int sock,void *buf,ssize_t bufsize,int *fd)

{
  cmsghdr *cmsg;
  anon_union_56_2_2032e646 cmsgu;
  iovec iov;
  msghdr msg;
  ssize_t size;
  int *fd_local;
  ssize_t bufsize_local;
  void *buf_local;
  int sock_local;
  
  if (fd == (int *)0x0) {
    msg._48_8_ = read(sock,buf,bufsize);
    if ((long)msg._48_8_ < 0) {
      perror("read");
      exit(1);
    }
  }
  else {
    iov.iov_len = 0;
    iov.iov_base = (void *)bufsize;
    msg._48_8_ = recvmsg(sock,(msghdr *)&iov.iov_len,0);
    if ((long)msg._48_8_ < 0) {
      perror("recvmsg");
      exit(1);
    }
    if ((&stack0x00000000 == (undefined1 *)0xb0) || (cmsg != (cmsghdr *)0x14)) {
      *fd = -1;
    }
    else {
      if (cmsgu._0_4_ != 1) {
        fprintf(_stderr,"invalid cmsg_level %d\n",(ulong)(uint)cmsgu._0_4_);
        exit(1);
      }
      *fd = cmsgu.cmsghdr.msg_namelen;
      printf("received fd %d\n",(ulong)(uint)*fd);
    }
  }
  return msg._48_8_;
}

Assistant:

ssize_t
sock_fd_read(int sock, void *buf, ssize_t bufsize, int *fd)
{
    ssize_t size;

    if(fd){
        struct msghdr msg;
        struct iovec iov;
        union{
            struct msghdr cmsghdr;
            char control[CMSG_SPACE(sizeof (int))];
        } cmsgu;
        struct cmsghdr *cmsg;

        iov.iov_base = buf;
        iov.iov_len = bufsize;

        msg.msg_name = NULL;
        msg.msg_namelen = 0;
        msg.msg_iov = &iov;
        msg.msg_iovlen = 1;
        msg.msg_control = cmsgu.control;
        msg.msg_controllen = sizeof(cmsgu.control);

        size = recvmsg(sock, &msg, 0);
        if(size < 0){
            perror ("recvmsg");
            exit(1);
        }
        cmsg = CMSG_FIRSTHDR(&msg);

        if(cmsg && cmsg->cmsg_len == CMSG_LEN(sizeof (int))){
            if(cmsg->cmsg_level !=SOL_SOCKET){
                fprintf(stderr, "invalid cmsg_level %d\n",
                        cmsg->cmsg_level);
                exit(1);
            }

            *fd = *((int *) CMSG_DATA(cmsg));
            printf ("received fd %d\n", *fd);
        } else {
            *fd = -1;
        }
    } else {
        size = read(sock, buf, bufsize);
        if(size < 0){
            perror("read");
            exit(1);
        }
    }
    return size;
}